

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

void __thiscall
icu_63::BMPSet::BMPSet
          (BMPSet *this,BMPSet *otherBMPSet,int32_t *newParentList,int32_t newParentListLength)

{
  long lVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  byte bVar4;
  
  bVar4 = 0;
  this->_vptr_BMPSet = (_func_int **)&PTR__BMPSet_003ef1f8;
  this->containsFFFD = otherBMPSet->containsFFFD;
  this->list = newParentList;
  this->listLength = newParentListLength;
  memcpy(this->latin1Contains,otherBMPSet->latin1Contains,0x100);
  memcpy(this->table7FF,otherBMPSet->table7FF,0x100);
  memcpy(this->bmpBlockBits,otherBMPSet->bmpBlockBits,0x100);
  piVar2 = otherBMPSet->list4kStarts;
  piVar3 = this->list4kStarts;
  for (lVar1 = 0x12; lVar1 != 0; lVar1 = lVar1 + -1) {
    *piVar3 = *piVar2;
    piVar2 = piVar2 + (ulong)bVar4 * -2 + 1;
    piVar3 = piVar3 + (ulong)bVar4 * -2 + 1;
  }
  return;
}

Assistant:

BMPSet::BMPSet(const BMPSet &otherBMPSet, const int32_t *newParentList, int32_t newParentListLength) :
        containsFFFD(otherBMPSet.containsFFFD),
        list(newParentList), listLength(newParentListLength) {
    uprv_memcpy(latin1Contains, otherBMPSet.latin1Contains, sizeof(latin1Contains));
    uprv_memcpy(table7FF, otherBMPSet.table7FF, sizeof(table7FF));
    uprv_memcpy(bmpBlockBits, otherBMPSet.bmpBlockBits, sizeof(bmpBlockBits));
    uprv_memcpy(list4kStarts, otherBMPSet.list4kStarts, sizeof(list4kStarts));
}